

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::GetDiscreteQuantileTemplated<duckdb::ListDiscreteQuantile>
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  LogicalType *in_RDX;
  
  PVar1 = type->physical_type_;
  if (PVar1 < INTERVAL) {
    switch(PVar1) {
    case INT8:
      ListDiscreteQuantile::GetFunction<signed_char,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      break;
    default:
      goto switchD_00de7ddb_caseD_4;
    case INT16:
      ListDiscreteQuantile::GetFunction<short,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      break;
    case INT32:
      ListDiscreteQuantile::GetFunction<int,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      break;
    case INT64:
      ListDiscreteQuantile::GetFunction<long,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      break;
    case FLOAT:
      ListDiscreteQuantile::GetFunction<float,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      break;
    case DOUBLE:
      ListDiscreteQuantile::GetFunction<double,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
    }
  }
  else {
    if (PVar1 == INTERVAL) {
      ListDiscreteQuantile::GetFunction<duckdb::interval_t,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      return __return_storage_ptr__;
    }
    if (PVar1 == VARCHAR) {
      ListDiscreteQuantile::GetFunction<duckdb::string_t,duckdb::QuantileStringType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      return __return_storage_ptr__;
    }
    if (PVar1 == INT128) {
      ListDiscreteQuantile::GetFunction<duckdb::hugeint_t,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      return __return_storage_ptr__;
    }
switchD_00de7ddb_caseD_4:
    ListDiscreteQuantile::GetFallback(__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetDiscreteQuantileTemplated(const LogicalType &type) {
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::INT8:
		return OP::template GetFunction<int8_t>(type);
	case PhysicalType::INT16:
		return OP::template GetFunction<int16_t>(type);
	case PhysicalType::INT32:
		return OP::template GetFunction<int32_t>(type);
	case PhysicalType::INT64:
		return OP::template GetFunction<int64_t>(type);
	case PhysicalType::INT128:
		return OP::template GetFunction<hugeint_t>(type);
	case PhysicalType::FLOAT:
		return OP::template GetFunction<float>(type);
	case PhysicalType::DOUBLE:
		return OP::template GetFunction<double>(type);
	case PhysicalType::INTERVAL:
		return OP::template GetFunction<interval_t>(type);
	case PhysicalType::VARCHAR:
		return OP::template GetFunction<string_t, QuantileStringType>(type);
#endif
	default:
		return OP::GetFallback(type);
	}
}